

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObjectPrivate::setObjectNameWithoutBindings(QObjectPrivate *this,QString *name)

{
  ensureExtraData(this);
  QString::operator=((QString *)&this->extraData->objectName,name);
  return;
}

Assistant:

void QObjectPrivate::setObjectNameWithoutBindings(const QString &name)
{
    ensureExtraData();
    extraData->objectName.setValueBypassingBindings(name);
}